

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

wchar_t detect_form(archive_read *a,wchar_t *is_form_d)

{
  byte bVar1;
  bool bVar2;
  ssize_t sVar3;
  int iVar4;
  wchar_t wVar5;
  byte *b;
  ulong uVar6;
  void *pvVar7;
  ssize_t sVar8;
  long lVar9;
  byte *pbVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int local_68;
  int local_64;
  ssize_t avail;
  byte *local_50;
  archive_read *local_48;
  ssize_t nl;
  ulong local_38;
  
  if (is_form_d != (wchar_t *)0x0) {
    *is_form_d = L'\0';
  }
  local_48 = a;
  b = (byte *)__archive_read_ahead(a,1,&avail);
  if (b == (byte *)0x0) {
    return L'\xffffffff';
  }
  local_64 = 0;
  iVar4 = 0;
  local_68 = 0;
  lVar17 = avail;
LAB_00545b3a:
  local_50 = (byte *)CONCAT44(local_50._4_4_,iVar4);
  do {
    uVar15 = avail;
    if (avail == 0) {
      nl = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = get_line_size((char *)b,avail,&nl);
    }
    bVar2 = false;
    while (nl == 0) {
      if ((bVar2) || (uVar15 != uVar6)) goto LAB_00545f7c;
      if (0xfffff < (long)uVar15) goto LAB_00545f6d;
      uVar6 = (ulong)((int)lVar17 + 0x3ffU & 0xfffffc00);
      pvVar7 = __archive_read_ahead(local_48,uVar6 << (uVar6 < lVar17 + 0xa0U),&avail);
      if (pvVar7 == (void *)0x0) {
        if (avail <= lVar17) {
          uVar6 = 0;
          goto LAB_00545f7c;
        }
        pvVar7 = __archive_read_ahead(local_48,avail,&avail);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      sVar3 = avail;
      b = (byte *)((long)pvVar7 + (lVar17 - uVar15));
      uVar16 = avail - (lVar17 - uVar15);
      avail = uVar16;
      sVar8 = get_line_size((char *)((long)pvVar7 + lVar17),uVar16 - uVar15,&nl);
      uVar6 = 0;
      if (-1 < sVar8) {
        uVar6 = uVar15;
      }
      uVar6 = uVar6 + sVar8;
      uVar15 = uVar16;
      lVar17 = sVar3;
    }
    if ((long)uVar6 < 1) goto LAB_00545f7c;
    uVar16 = ~nl;
    if ((int)local_50 != 0) {
      wVar5 = bid_keyword_list((char *)b,uVar6,L'\0',L'\0');
      if (wVar5 < L'\x01') goto LAB_00545f6d;
      b = b + uVar6;
      iVar4 = (int)local_50;
      if ((b[uVar16] != 0x5c) && (iVar4 = 0, (int)local_50 == 1)) {
        if (1 < local_64) goto LAB_00545f90;
        local_64 = local_64 + 1;
        iVar4 = 0;
      }
      avail = uVar15 - uVar6;
      goto LAB_00545b3a;
    }
    pbVar14 = b + uVar6;
    pbVar10 = b + uVar16;
    uVar11 = uVar15;
    for (uVar13 = uVar6; uVar11 = uVar11 - 1, 0 < (long)uVar13; uVar13 = uVar13 - 1) {
      bVar1 = *b;
      if ((bVar1 != 0x20) && (uVar6 = uVar13, bVar1 != 9)) goto LAB_00545c8a;
      b = b + 1;
      uVar15 = uVar15 - 1;
      pbVar10 = pbVar10 + 1;
      avail = uVar11;
    }
    bVar1 = *pbVar14;
    uVar6 = 0;
    b = pbVar14;
LAB_00545c8a:
    if (((bVar1 != 10) && (bVar1 != 0xd)) && (bVar1 != 0x23)) break;
    b = b + uVar6;
    if ((long)uVar13 < 1) {
      uVar13 = 0;
    }
    avail = uVar15 - uVar13;
  } while( true );
  if (bVar1 != 0x2f) {
    lVar9 = -nl;
    local_50 = b + uVar6;
    uVar11 = 0;
    if (0 < (long)uVar13) {
      uVar11 = uVar13;
    }
    bVar2 = true;
    for (pbVar14 = b; pbVar14 < local_50; pbVar14 = pbVar14 + 1) {
      bVar1 = *pbVar14;
      if (bid_entry_safe_char[bVar1] == '\0') {
        if ((0x20 < bVar1) || ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0))
        goto LAB_00545dcb;
        break;
      }
      uVar11 = uVar11 - 1;
      bVar2 = false;
    }
    if (bVar2) {
LAB_00545dcb:
      if ((((b <= local_50 + lVar9 + -2) && (local_50[lVar9 + -1] == 0x5c)) &&
          ((bVar1 = local_50[lVar9 + -2], bVar1 == 9 || (bVar1 == 0x20)))) ||
         ((b <= local_50 + lVar9 + -1 && (local_50[lVar9 + -1] == 0x5c)))) goto LAB_00545f7c;
      lVar12 = 0;
      uVar11 = 0;
      if (0 < (long)uVar13) {
        uVar11 = uVar13;
      }
      bVar2 = false;
      for (pbVar10 = pbVar10 + uVar11 + ((long)uVar13 >> 0x3f & uVar13); b <= pbVar10;
          pbVar10 = pbVar10 + -1) {
        bVar1 = *pbVar10;
        if ((bVar1 == 9) || (bVar1 == 0x20)) break;
        if (bid_entry_safe_char[bVar1] == '\0') goto LAB_00545f7c;
        if (bVar1 == 0x2f) {
          bVar2 = true;
        }
        lVar12 = lVar12 + 1;
      }
      if ((((int)lVar12 == 0) || (!bVar2)) || (pbVar10[1] == 0x2f)) goto LAB_00545f7c;
      bVar2 = false;
      uVar11 = 0;
      if (0 < (long)uVar13) {
        uVar11 = uVar13;
      }
      uVar11 = (lVar9 + uVar11) - lVar12;
      wVar5 = L'\x01';
      pbVar14 = b;
    }
    else {
      wVar5 = L'\0';
      bVar2 = true;
    }
    local_38 = uVar16;
    wVar5 = bid_keyword_list((char *)pbVar14,uVar11,L'\0',wVar5);
    if (wVar5 < L'\0') goto LAB_00545f7c;
    if (local_68 == 1) {
      if ((bool)(bVar2 & wVar5 != L'\0')) {
        local_68 = 1;
        goto LAB_00545f7c;
      }
LAB_00545f26:
      if (bVar2) {
LAB_00545f2b:
        if (local_50[local_38] == 0x5c) {
          iVar4 = 1;
          goto LAB_00545f4c;
        }
      }
    }
    else {
      if (local_68 != 0) goto LAB_00545f26;
      local_68 = 1;
      if (bVar2) {
        local_68 = -(uint)(wVar5 != L'\0');
        goto LAB_00545f2b;
      }
    }
    if (1 < local_64) goto LAB_00545f90;
    local_64 = local_64 + 1;
    iVar4 = 0;
    goto LAB_00545f4c;
  }
  if (uVar6 < 5) goto LAB_00545f7c;
  iVar4 = strncmp((char *)b,"/set",4);
  if (iVar4 == 0) {
    pbVar14 = b + 4;
    lVar9 = uVar6 - 4;
    wVar5 = L'\0';
LAB_00545ef3:
    wVar5 = bid_keyword_list((char *)pbVar14,lVar9,wVar5,L'\0');
    if (L'\0' < wVar5) {
      iVar4 = (uint)(b[uVar16 + uVar6] == 0x5c) * 2;
LAB_00545f4c:
      b = b + uVar6;
      if ((long)uVar13 < 1) {
        uVar13 = 0;
      }
      avail = uVar15 - uVar13;
      goto LAB_00545b3a;
    }
  }
  else if ((6 < uVar6) && (iVar4 = strncmp((char *)b,"/unset",6), iVar4 == 0)) {
    pbVar14 = b + 6;
    lVar9 = uVar6 - 6;
    wVar5 = L'\x01';
    goto LAB_00545ef3;
  }
LAB_00545f6d:
  uVar6 = 0xffffffffffffffff;
LAB_00545f7c:
  if (local_64 < 3) {
    if (local_64 < 1) {
      return L'\0';
    }
    if (uVar6 != 0) {
      return L'\0';
    }
  }
LAB_00545f90:
  if ((is_form_d != (wchar_t *)0x0) && (local_68 == 1)) {
    *is_form_d = L'\x01';
  }
  return L' ';
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}